

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *pWVar1;
  word *pwVar2;
  SegmentReader **ppSVar3;
  SegmentReader **ppSVar4;
  SegmentReader **ppSVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Exception *pEVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 *puVar15;
  DebugComparison<int_&,_int> *pDVar16;
  uint uVar17;
  char *pcVar18;
  WirePointer *pWVar19;
  Array<char> *pAVar20;
  uint uVar21;
  WirePointer *pWVar22;
  Array<char> *pAVar23;
  bool bVar24;
  MessageSizeCounts MVar25;
  SegmentReader *segment_local;
  int nestingLimit_local;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  Iterator __end7;
  WordCountN<29> wordCount;
  Fault f_3;
  
  uVar9 = (ref->offsetAndKind).value;
  puVar15 = (undefined1 *)0x0;
  if ((ref->field_1).upper32Bits != 0 || uVar9 != 0) {
    _kjCondition.left = &nestingLimit_local;
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = 0 < nestingLimit;
    segment_local = segment;
    if (nestingLimit < 1) {
      pDVar16 = (DebugComparison<int_&,_int> *)&f;
      nestingLimit_local = nestingLimit;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[30]>
                ((Fault *)pDVar16,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x312,FAILED,"nestingLimit > 0","_kjCondition,\"Message is too deeply-nested.\"",
                 &_kjCondition,(char (*) [30])"Message is too deeply-nested.");
    }
    else {
      nestingLimit_local = nestingLimit + -1;
      pWVar19 = ref + 1;
      lVar13 = (long)((int)uVar9 >> 2);
      if (segment == (SegmentReader *)0x0) {
        pWVar22 = pWVar19 + lVar13;
        ppSVar3 = (SegmentReader **)_kjCondition.left;
        ppSVar4 = (SegmentReader **)_kjCondition.left;
        ppSVar5 = (SegmentReader **)_kjCondition.left;
        switch(uVar9 & 3) {
        case 1:
          goto switchD_001285d2_caseD_1;
        case 2:
          goto switchD_001285d2_caseD_2;
        case 3:
          goto switchD_001285d2_caseD_3;
        }
        goto switchD_001285d2_caseD_0;
      }
      pwVar2 = (segment->ptr).ptr;
      pWVar1 = (WirePointer *)(pwVar2 + (segment->ptr).size_);
      pWVar22 = pWVar19 + lVar13;
      if ((long)pWVar1 - (long)pWVar19 >> 3 < lVar13) {
        pWVar22 = pWVar1;
      }
      if (lVar13 < (long)pwVar2 - (long)pWVar19 >> 3) {
        pWVar22 = pWVar1;
      }
      if ((uVar9 & 3) == 2) {
        iVar6 = (*segment->arena->_vptr_Arena[2])();
        segment_local = (SegmentReader *)CONCAT44(extraout_var,iVar6);
        _kjCondition.right = 0;
        _kjCondition._12_4_ = 0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = segment_local != (SegmentReader *)0x0;
        if (segment_local == (SegmentReader *)0x0) {
          pDVar16 = (DebugComparison<int_&,_int> *)&f;
          _kjCondition.left = (int *)&segment_local;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                    ((Fault *)pDVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x244,FAILED,"segment != nullptr",
                     "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                     (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                     (char (*) [49])"Message contains far pointer to unknown segment.");
          goto LAB_001287b6;
        }
        uVar9 = (ref->offsetAndKind).value;
        uVar14 = (ulong)(uVar9 >> 3);
        uVar12 = (segment_local->ptr).size_;
        if ((long)uVar12 < (long)uVar14) {
          uVar14 = uVar12;
        }
        uVar11 = 2 - (ulong)((uVar9 & 4) == 0);
        _kjCondition.left = (int *)&segment_local;
        if (uVar14 + uVar11 <= uVar12) {
          pWVar19 = (WirePointer *)((segment_local->ptr).ptr + uVar14);
          uVar12 = segment_local->readLimiter->limit;
          if (uVar11 <= uVar12) {
            segment_local->readLimiter->limit = uVar12 - uVar11;
            if (((ref->offsetAndKind).value & 4) != 0) {
              _kjCondition.left = (int *)&segment_local;
              iVar6 = (*segment_local->arena->_vptr_Arena[2])
                                (segment_local->arena,(ulong)(pWVar19->field_1).upper32Bits);
              f.exception = (Exception *)CONCAT44(extraout_var_00,iVar6);
              _kjCondition.left = (int *)&f;
              _kjCondition.right = 0;
              _kjCondition._12_4_ = 0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = f.exception != (Exception *)0x0;
              if (f.exception == (Exception *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          (&f_3,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,(DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
                            &_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_00128999:
                pWVar22 = (WirePointer *)0x0;
                kj::_::Debug::Fault::~Fault(&f_3);
              }
              else {
                uVar9 = (pWVar19->offsetAndKind).value & 3;
                _kjCondition.left = (int *)CONCAT44(2,uVar9);
                _kjCondition._8_8_ = anon_var_dwarf_1d37f;
                _kjCondition.op.content.ptr = (char *)0x5;
                _kjCondition.op.content.size_ = (size_t)(uVar9 == 2);
                if (uVar9 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            (&f_3,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_00128999;
                }
                pcVar18 = (char *)(ulong)((pWVar19->offsetAndKind).value >> 3);
                if ((long)(f.exception)->file < (long)pcVar18) {
                  pcVar18 = (f.exception)->file;
                }
                pWVar22 = (WirePointer *)
                          (((ArrayPtr<const_capnp::word> *)
                           &((f.exception)->ownFile).content.disposer)->ptr + (long)pcVar18);
                segment_local = (SegmentReader *)f.exception;
              }
              ref = pWVar19 + 1;
              goto LAB_00128468;
            }
            pWVar1 = pWVar19 + 1;
            uVar9 = (pWVar19->offsetAndKind).value;
            lVar13 = (long)((int)uVar9 >> 2);
            ref = pWVar19;
            if (segment_local == (SegmentReader *)0x0) {
              pWVar22 = pWVar1 + lVar13;
              _kjCondition.left = (int *)&segment_local;
              ppSVar3 = &segment_local;
              ppSVar4 = &segment_local;
              ppSVar5 = &segment_local;
              switch(uVar9 & 3) {
              case 1:
                goto switchD_001285d2_caseD_1;
              case 2:
                goto switchD_001285d2_caseD_2;
              case 3:
                goto switchD_001285d2_caseD_3;
              }
            }
            else {
              pwVar2 = (segment_local->ptr).ptr;
              pWVar22 = (WirePointer *)(pwVar2 + (segment_local->ptr).size_);
              _kjCondition.left = (int *)&segment_local;
              if ((lVar13 < (long)pwVar2 - (long)pWVar1 >> 3) ||
                 (_kjCondition.left = (int *)&segment_local,
                 (long)pWVar22 - (long)pWVar1 >> 3 < lVar13)) goto LAB_00128468;
              pWVar22 = pWVar1 + lVar13;
              _kjCondition.left = (int *)&segment_local;
              ppSVar3 = &segment_local;
              ppSVar4 = &segment_local;
              ppSVar5 = &segment_local;
              switch(uVar9 & 3) {
              case 1:
                goto switchD_001285d2_caseD_1;
              case 2:
                goto switchD_001285d2_caseD_2;
              case 3:
                goto switchD_001285d2_caseD_3;
              }
            }
            goto switchD_001285d2_caseD_0;
          }
          _kjCondition.left = (int *)&segment_local;
          (*segment_local->arena->_vptr_Arena[3])();
        }
        f.exception = f.exception & 0xffffffffffffff00;
        pDVar16 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)pDVar16,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&f,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      else {
LAB_00128468:
        if (pWVar22 == (WirePointer *)0x0) goto LAB_001287c2;
        uVar9 = (ref->offsetAndKind).value;
        ppSVar3 = (SegmentReader **)_kjCondition.left;
        ppSVar4 = (SegmentReader **)_kjCondition.left;
        ppSVar5 = (SegmentReader **)_kjCondition.left;
        switch(uVar9 & 3) {
        case 0:
switchD_001285d2_caseD_0:
          _kjCondition.left = (int *)ppSVar5;
          uVar8 = *(ushort *)&ref->field_1;
          if (segment_local == (SegmentReader *)0x0) {
LAB_001285ef:
            uVar12 = (ulong)(ref->field_1).structRef.ptrCount.value;
            pAVar23 = (Array<char> *)(uVar12 + uVar8);
            puVar15 = (undefined1 *)0x0;
            if (uVar12 != 0) {
              pWVar22 = pWVar22 + uVar8;
              puVar15 = (undefined1 *)0x0;
              do {
                MVar25 = totalSize(segment_local,pWVar22,nestingLimit_local);
                pAVar23 = (Array<char> *)((long)&pAVar23->ptr + MVar25.wordCount);
                puVar15 = (undefined1 *)(ulong)((int)puVar15 + MVar25.capCount);
                pWVar22 = pWVar22 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            goto LAB_001287c5;
          }
          uVar12 = (ulong)(ref->field_1).structRef.ptrCount.value + (ulong)uVar8;
          if (((long)pWVar22 - (long)(segment_local->ptr).ptr >> 3) + uVar12 <=
              (segment_local->ptr).size_) {
            uVar14 = segment_local->readLimiter->limit;
            if (uVar12 <= uVar14) {
              segment_local->readLimiter->limit = uVar14 - uVar12;
              uVar8 = (ref->field_1).structRef.dataSize.value;
              goto LAB_001285ef;
            }
            (*segment_local->arena->_vptr_Arena[3])();
          }
          f.exception = f.exception & 0xffffffffffffff00;
          pDVar16 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                    ((Fault *)pDVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x322,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                     "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [322])
                     "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          break;
        case 1:
switchD_001285d2_caseD_1:
          _kjCondition.left = (int *)ppSVar4;
          uVar9 = (ref->field_1).upper32Bits;
          pAVar23 = (Array<char> *)(ulong)(uVar9 & 7);
          switch(uVar9 & 7) {
          case 0:
            puVar15 = (undefined1 *)pAVar23;
            goto LAB_001287c5;
          default:
            pAVar23 = (Array<char> *)
                      ((ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (long)pAVar23 * 4) *
                       (ulong)(uVar9 >> 3) + 0x3f >> 6);
            if (segment_local == (SegmentReader *)0x0) goto LAB_001287c5;
            uVar12 = (ulong)pAVar23 & 0xffffffff;
            if (((long)pWVar22 - (long)(segment_local->ptr).ptr >> 3) + uVar12 <=
                (segment_local->ptr).size_) {
              uVar14 = segment_local->readLimiter->limit;
              if (uVar12 <= uVar14) {
                segment_local->readLimiter->limit = uVar14 - uVar12;
                goto LAB_001287c5;
              }
              (*segment_local->arena->_vptr_Arena[3])();
            }
            pcVar18 = "boundsCheck(segment, ptr, totalWords)";
            iVar6 = 0x33d;
            break;
          case 6:
            if (segment_local == (SegmentReader *)0x0) {
LAB_00128a5d:
              pAVar20 = (Array<char> *)(ulong)(uVar9 >> 3);
              pAVar23 = pAVar20;
              if (7 < uVar9) {
                puVar15 = (undefined1 *)0x0;
                do {
                  MVar25 = totalSize(segment_local,pWVar22,nestingLimit_local);
                  pAVar23 = (Array<char> *)((long)&pAVar23->ptr + MVar25.wordCount);
                  puVar15 = (undefined1 *)(ulong)((int)puVar15 + MVar25.capCount);
                  pWVar22 = pWVar22 + 1;
                  pAVar20 = (Array<char> *)((long)&pAVar20[0xffffffffffffffff].disposer + 7);
                } while (pAVar20 != (Array<char> *)0x0);
              }
              goto LAB_001287c5;
            }
            uVar12 = (ulong)(uVar9 >> 3);
            if (((long)pWVar22 - (long)(segment_local->ptr).ptr >> 3) + uVar12 <=
                (segment_local->ptr).size_) {
              uVar14 = segment_local->readLimiter->limit;
              if (uVar12 <= uVar14) {
                segment_local->readLimiter->limit = uVar14 - uVar12;
                goto LAB_00128a5d;
              }
              (*segment_local->arena->_vptr_Arena[3])();
            }
            pcVar18 = "boundsCheck(segment, ptr, count * WORDS_PER_POINTER)";
            iVar6 = 0x348;
            break;
          case 7:
            wordCount = uVar9 >> 3;
            if (segment_local == (SegmentReader *)0x0) {
LAB_001289c7:
              uVar9 = (pWVar22->offsetAndKind).value;
              uVar10 = uVar9 & 3;
              _kjCondition.left = (int *)(ulong)uVar10;
              _kjCondition._8_8_ = anon_var_dwarf_1d37f;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ =
                   CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 0);
              if (uVar10 == 0) {
                uVar9 = uVar9 >> 2 & 0x1fffffff;
                f.exception = (Exception *)
                              (((ulong)(pWVar22->field_1).structRef.ptrCount.value +
                               (ulong)(pWVar22->field_1).structRef.dataSize.value) * (ulong)uVar9);
                _kjCondition.left = (int *)&f;
                pEVar7 = (Exception *)(ulong)wordCount;
                _kjCondition._8_8_ = &wordCount;
                _kjCondition.op.content.ptr = " <= ";
                _kjCondition.op.content.size_ = 5;
                bVar24 = (long)f.exception - (long)pEVar7 == 0;
                _kjCondition.result = f.exception < pEVar7 || bVar24;
                if (f.exception < pEVar7 || bVar24) {
                  pAVar23 = (Array<char> *)((long)&((f.exception)->ownFile).content.ptr + 1);
                  uVar10 = (uint)(pWVar22->field_1).structRef.ptrCount.value;
                  puVar15 = (undefined1 *)0x0;
                  if ((uVar10 != 0) && (puVar15 = (undefined1 *)0x0, uVar9 != 0)) {
                    uVar8 = (pWVar22->field_1).structRef.dataSize.value;
                    puVar15 = (undefined1 *)0x0;
                    uVar17 = 0;
                    do {
                      pWVar22 = pWVar22 + uVar8;
                      uVar21 = uVar10;
                      do {
                        pWVar22 = pWVar22 + 1;
                        MVar25 = totalSize(segment_local,pWVar22,nestingLimit_local);
                        pAVar23 = (Array<char> *)((long)pAVar23 + MVar25.wordCount);
                        puVar15 = (undefined1 *)(ulong)((int)puVar15 + MVar25.capCount);
                        uVar21 = uVar21 - 1;
                      } while (uVar21 != 0);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != uVar9);
                  }
                  goto LAB_001287c5;
                }
                pDVar16 = (DebugComparison<int_&,_int> *)&f_3;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&,char_const(&)[319]>
                          ((Fault *)pDVar16,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x368,FAILED,"actualSize <= wordCount",
                           "_kjCondition,\"Struct list pointer\'s elements overran size. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                           ,(DebugComparison<unsigned_long_&,_unsigned_int_&> *)&_kjCondition,
                           (char (*) [319])
                           "Struct list pointer\'s elements overran size. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                          );
                goto LAB_001287b6;
              }
              pDVar16 = (DebugComparison<int_&,_int> *)&f;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[54]>
                        ((Fault *)pDVar16,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x360,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                         "_kjCondition,\"Don\'t know how to handle non-STRUCT inline composite.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
            }
            else {
              if (((long)pWVar22 - (long)(segment_local->ptr).ptr >> 3) + (ulong)wordCount + 1 <=
                  (segment_local->ptr).size_) {
                uVar14 = (ulong)wordCount + 1;
                uVar12 = segment_local->readLimiter->limit;
                if (uVar14 <= uVar12) {
                  segment_local->readLimiter->limit = uVar12 - uVar14;
                  goto LAB_001289c7;
                }
                (*segment_local->arena->_vptr_Arena[3])();
              }
              f.exception = f.exception & 0xffffffffffffff00;
              pDVar16 = &_kjCondition;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                        ((Fault *)pDVar16,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x358,FAILED,
                         "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                         "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)&f,
                         (char (*) [320])
                         "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
            }
            kj::_::Debug::Fault::~Fault((Fault *)pDVar16);
            goto LAB_001287c2;
          }
          f.exception = f.exception & 0xffffffffffffff00;
          pDVar16 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar6,FAILED,pcVar18,
                     "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [320])
                     "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          break;
        case 2:
switchD_001285d2_caseD_2:
          _kjCondition.left = (int *)ppSVar3;
          pDVar16 = &_kjCondition;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    ((Fault *)pDVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x385,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          break;
        case 3:
switchD_001285d2_caseD_3:
          pAVar23 = (Array<char> *)(undefined1 *)0x0;
          if (uVar9 == 3) {
            puVar15 = (undefined1 *)0x1;
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x38d,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                       (char (*) [22])"Unknown pointer type.");
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            puVar15 = (undefined1 *)0x0;
          }
          goto LAB_001287c5;
        }
      }
    }
LAB_001287b6:
    kj::_::Debug::Fault::~Fault((Fault *)pDVar16);
  }
LAB_001287c2:
  puVar15 = (undefined1 *)0x0;
  pAVar23 = (Array<char> *)(undefined1 *)0x0;
LAB_001287c5:
  MVar25._8_8_ = puVar15;
  MVar25.wordCount = (WordCountN<61,_uint64_t>)pAVar23;
  return MVar25;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_SOME(p, followFars(ref, ref->target(segment), segment)) {
      ptr = &p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }